

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  string *val;
  pointer pbVar1;
  pointer pbVar2;
  pointer puVar3;
  pointer psVar4;
  size_type sVar5;
  bool bVar6;
  size_t sVar7;
  App *pAVar8;
  ExtrasError *this_00;
  pointer puVar9;
  pointer psVar10;
  Option *pOVar11;
  string pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  val = pbVar1 + -1;
  if ((this->positionals_at_end_ == true) &&
     (pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     sVar7 = _count_remaining_positionals(this,true),
     (ulong)((long)pbVar1 - (long)pbVar2 >> 5) <= sVar7)) {
    puVar3 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (this->options_).
                  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1)
    {
      pOVar11 = (puVar9->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if ((((pOVar11->pname_)._M_string_length != 0) &&
          ((pOVar11->super_OptionBase<CLI::Option>).required_ == true)) &&
         ((int)((ulong)((long)*(pointer *)
                               ((long)&(pOVar11->results_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               + 8) -
                       *(long *)&(pOVar11->results_).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data) >> 5) <
          pOVar11->expected_min_ * pOVar11->type_size_min_)) {
        if (this->validate_positionals_ == true) {
          ::std::__cxx11::string::string((string *)&pos,(string *)val);
          Option::_validate(&local_50,
                            (puVar9->_M_t).
                            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                            .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&pos,0);
          ::std::__cxx11::string::operator=((string *)&pos,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          sVar5 = pos._M_string_length;
          ::std::__cxx11::string::~string((string *)&pos);
          if (sVar5 != 0) goto LAB_0011c98d;
          pOVar11 = (puVar9->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        }
        ::std::__cxx11::string::string((string *)&local_70,(string *)val);
        Option::add_result(pOVar11,&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        pos._M_dataplus._M_p =
             (pointer)(puVar9->_M_t).
                      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        goto LAB_0011c9ca;
      }
LAB_0011c98d:
    }
  }
  puVar9 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar9 == puVar3) {
      psVar4 = (this->subcommands_).
               super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar10 = (this->subcommands_).
                     super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar4;
          psVar10 = psVar10 + 1) {
        pAVar8 = (psVar10->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((((pAVar8->name_)._M_string_length == 0) && (pAVar8->disabled_ == false)) &&
           (bVar6 = _parse_positional(pAVar8,args,false), bVar6)) {
          pAVar8 = (psVar10->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (pAVar8->pre_parse_called_ == false) {
            _trigger_pre_parse(pAVar8,(long)(args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 5);
            return true;
          }
          return true;
        }
      }
      if ((this->parent_ != (App *)0x0) && (this->fallthrough_ == true)) {
        pAVar8 = _get_fallthrough_parent(this);
        bVar6 = _parse_positional(pAVar8,args,
                                  (this->parse_complete_callback_).super__Function_base._M_manager
                                  != (_Manager_type)0x0);
        return bVar6;
      }
      pAVar8 = _find_subcommand(this,(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
      if ((pAVar8 == (App *)0x0) ||
         ((this->require_subcommand_max_ != 0 &&
          (this->require_subcommand_max_ <=
           (ulong)((long)(this->parsed_subcommands_).
                         super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->parsed_subcommands_).
                         super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3))))) {
        pAVar8 = this;
        if (this->parent_ != (App *)0x0) {
          pAVar8 = _get_fallthrough_parent(this);
        }
        pAVar8 = _find_subcommand(pAVar8,(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish + -1,true,false
                                 );
        if (pAVar8 != (App *)0x0) {
          pAVar8 = pAVar8->parent_;
          if (pAVar8->require_subcommand_max_ == 0) {
            return false;
          }
          if ((ulong)((long)(pAVar8->parsed_subcommands_).
                            super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pAVar8->parsed_subcommands_).
                            super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) < pAVar8->require_subcommand_max_
             ) {
            return false;
          }
        }
        if (this->positionals_at_end_ == true) {
          this_00 = (ExtrasError *)__cxa_allocate_exception(0x38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a8,args);
          ExtrasError::ExtrasError(this_00,&this->name_,&local_a8);
          __cxa_throw(this_00,&ExtrasError::typeinfo,Error::~Error);
        }
        if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
          _move_to_missing(this,NONE,val);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(args);
          if (this->prefix_command_ == true) {
            while (pbVar1 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish,
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start != pbVar1) {
              _move_to_missing(this,NONE,pbVar1 + -1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(args);
            }
            return true;
          }
          return true;
        }
      }
      else if (!haltOnSubcommand) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        _parse(pAVar8,args);
        return true;
      }
      return false;
    }
    pOVar11 = (puVar9->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
              _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (((pOVar11->pname_)._M_string_length != 0) &&
       (((int)((ulong)((long)*(pointer *)
                              ((long)&(pOVar11->results_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              + 8) -
                      *(long *)&(pOVar11->results_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data) >> 5) <
         pOVar11->expected_min_ * pOVar11->type_size_min_ || (pOVar11->allow_extra_args_ == true))))
    {
      if (this->validate_positionals_ != true) {
LAB_0011c999:
        ::std::__cxx11::string::string((string *)&local_90,(string *)val);
        Option::add_result(pOVar11,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        pos._M_dataplus._M_p =
             (pointer)(puVar9->_M_t).
                      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
LAB_0011c9ca:
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                   (Option **)&pos);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        return true;
      }
      ::std::__cxx11::string::string((string *)&pos,(string *)val);
      Option::_validate(&local_50,
                        (puVar9->_M_t).
                        super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                        super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                        super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&pos,0);
      ::std::__cxx11::string::operator=((string *)&pos,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      sVar5 = pos._M_string_length;
      ::std::__cxx11::string::~string((string *)&pos);
      if (sVar5 == 0) {
        pOVar11 = (puVar9->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        goto LAB_0011c999;
      }
    }
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

bool _parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

        const std::string &positional = args.back();

        if(positionals_at_end_) {
            // deal with the case of required arguments at the end which should take precedence over other arguments
            auto arg_rem = args.size();
            auto remreq = _count_remaining_positionals(true);
            if(arg_rem <= remreq) {
                for(const Option_p &opt : options_) {
                    if(opt->get_positional() && opt->required_) {
                        if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                            if(validate_positionals_) {
                                std::string pos = positional;
                                pos = opt->_validate(pos, 0);
                                if(!pos.empty()) {
                                    continue;
                                }
                            }
                            opt->add_result(positional);
                            parse_order_.push_back(opt.get());
                            args.pop_back();
                            return true;
                        }
                    }
                }
            }
        }
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_min() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                opt->add_result(positional);
                parse_order_.push_back(opt.get());
                args.pop_back();
                return true;
            }
        }

        for(auto &subc : subcommands_) {
            if((subc->name_.empty()) && (!subc->disabled_)) {
                if(subc->_parse_positional(args, false)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        // let the parent deal with it if possible
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));

        /// Try to find a local subcommand that is repeated
        auto com = _find_subcommand(args.back(), true, false);
        if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
            if(haltOnSubcommand) {
                return false;
            }
            args.pop_back();
            com->_parse(args);
            return true;
        }
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }

        if(positionals_at_end_) {
            throw CLI::ExtrasError(name_, args);
        }
        /// If this is an option group don't deal with it
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }
        /// We are out of other options this goes to missing
        _move_to_missing(detail::Classifier::NONE, positional);
        args.pop_back();
        if(prefix_command_) {
            while(!args.empty()) {
                _move_to_missing(detail::Classifier::NONE, args.back());
                args.pop_back();
            }
        }

        return true;
    }